

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlBufGetNodeContent(xmlBufPtr buf,xmlNode *cur)

{
  _xmlNode *p_Var1;
  xmlEntityPtr pxVar2;
  long lVar3;
  xmlNode *pxVar4;
  
  if (buf == (xmlBufPtr)0x0 || cur == (xmlNode *)0x0) {
    return -1;
  }
  switch(cur->type) {
  case XML_ELEMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
    pxVar4 = cur;
    if (cur != (xmlNode *)0x0) {
      do {
        if (pxVar4->type - XML_TEXT_NODE < 2) {
          if (pxVar4->content != (xmlChar *)0x0) {
            xmlBufCat(buf,pxVar4->content);
          }
        }
        else if (pxVar4->type == XML_ENTITY_REF_NODE) {
          xmlBufGetNodeContent(buf,pxVar4);
        }
        p_Var1 = pxVar4->children;
        if ((p_Var1 == (_xmlNode *)0x0) || (p_Var1->type == XML_ENTITY_DECL)) {
          if (pxVar4 == cur) {
            return 0;
          }
          do {
            p_Var1 = pxVar4->next;
            if (p_Var1 != (_xmlNode *)0x0) break;
            pxVar4 = pxVar4->parent;
            if (pxVar4 == (xmlNode *)0x0) {
              p_Var1 = (_xmlNode *)0x0;
              break;
            }
            p_Var1 = (_xmlNode *)0x0;
          } while (pxVar4 != cur);
        }
        pxVar4 = p_Var1;
      } while (p_Var1 != (_xmlNode *)0x0);
    }
    break;
  case XML_ATTRIBUTE_NODE:
    for (p_Var1 = cur->children; p_Var1 != (xmlNode *)0x0; p_Var1 = p_Var1->next) {
      if (p_Var1->type == XML_TEXT_NODE) {
        xmlBufCat(buf,p_Var1->content);
      }
      else {
        xmlBufGetNodeContent(buf,p_Var1);
      }
    }
    break;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    lVar3 = 0x50;
    goto LAB_001870cd;
  case XML_ENTITY_REF_NODE:
    pxVar2 = xmlGetDocEntity(cur->doc,cur->name);
    if (pxVar2 == (xmlEntityPtr)0x0) {
      return -1;
    }
    for (p_Var1 = pxVar2->children; p_Var1 != (xmlNode *)0x0; p_Var1 = p_Var1->next) {
      xmlBufGetNodeContent(buf,p_Var1);
    }
    if (pxVar2 == (xmlEntityPtr)0x0) {
      return -1;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    for (pxVar4 = cur->children; pxVar4 != (xmlNode *)0x0; pxVar4 = pxVar4->next) {
      if ((pxVar4->type < XML_ENTITY_REF_NODE) &&
         ((0x1aU >> (pxVar4->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
        xmlBufGetNodeContent(buf,pxVar4);
      }
    }
    break;
  case XML_NAMESPACE_DECL:
    lVar3 = 0x10;
LAB_001870cd:
    xmlBufCat(buf,*(xmlChar **)((long)&cur->_private + lVar3));
  }
  return 0;
}

Assistant:

int
xmlBufGetNodeContent(xmlBufPtr buf, const xmlNode *cur)
{
    if ((cur == NULL) || (buf == NULL)) return(-1);
    switch (cur->type) {
        case XML_CDATA_SECTION_NODE:
        case XML_TEXT_NODE:
	    xmlBufCat(buf, cur->content);
            break;
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:{
                const xmlNode *tmp = cur;

                while (tmp != NULL) {
                    switch (tmp->type) {
                        case XML_CDATA_SECTION_NODE:
                        case XML_TEXT_NODE:
                            if (tmp->content != NULL)
                                xmlBufCat(buf, tmp->content);
                            break;
                        case XML_ENTITY_REF_NODE:
                            xmlBufGetNodeContent(buf, tmp);
                            break;
                        default:
                            break;
                    }
                    /*
                     * Skip to next node
                     */
                    if (tmp->children != NULL) {
                        if (tmp->children->type != XML_ENTITY_DECL) {
                            tmp = tmp->children;
                            continue;
                        }
                    }
                    if (tmp == cur)
                        break;

                    if (tmp->next != NULL) {
                        tmp = tmp->next;
                        continue;
                    }

                    do {
                        tmp = tmp->parent;
                        if (tmp == NULL)
                            break;
                        if (tmp == cur) {
                            tmp = NULL;
                            break;
                        }
                        if (tmp->next != NULL) {
                            tmp = tmp->next;
                            break;
                        }
                    } while (tmp != NULL);
                }
		break;
            }
        case XML_ATTRIBUTE_NODE:{
                xmlAttrPtr attr = (xmlAttrPtr) cur;
		xmlNodePtr tmp = attr->children;

		while (tmp != NULL) {
		    if (tmp->type == XML_TEXT_NODE)
		        xmlBufCat(buf, tmp->content);
		    else
		        xmlBufGetNodeContent(buf, tmp);
		    tmp = tmp->next;
		}
                break;
            }
        case XML_COMMENT_NODE:
        case XML_PI_NODE:
	    xmlBufCat(buf, cur->content);
            break;
        case XML_ENTITY_REF_NODE:{
                xmlEntityPtr ent;
                xmlNodePtr tmp;

                /* lookup entity declaration */
                ent = xmlGetDocEntity(cur->doc, cur->name);
                if (ent == NULL)
                    return(-1);

                /* an entity content can be any "well balanced chunk",
                 * i.e. the result of the content [43] production:
                 * http://www.w3.org/TR/REC-xml#NT-content
                 * -> we iterate through child nodes and recursive call
                 * xmlNodeGetContent() which handles all possible node types */
                tmp = ent->children;
                while (tmp) {
		    xmlBufGetNodeContent(buf, tmp);
                    tmp = tmp->next;
                }
		break;
            }
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    cur = cur->children;
	    while (cur!= NULL) {
		if ((cur->type == XML_ELEMENT_NODE) ||
		    (cur->type == XML_TEXT_NODE) ||
		    (cur->type == XML_CDATA_SECTION_NODE)) {
		    xmlBufGetNodeContent(buf, cur);
		}
		cur = cur->next;
	    }
	    break;
        case XML_NAMESPACE_DECL:
	    xmlBufCat(buf, ((xmlNsPtr) cur)->href);
	    break;
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
            break;
    }
    return(0);
}